

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O1

void deqp::gles3::Functional::logComment(TestContext *testCtx,char *comment)

{
  ostringstream *this;
  size_t sVar1;
  undefined1 local_190 [384];
  
  local_190._0_8_ = testCtx->m_log;
  this = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ",3);
  if (comment == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(local_190._8_8_ + -0x18));
  }
  else {
    sVar1 = strlen(comment);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,comment,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  return;
}

Assistant:

static void logComment (tcu::TestContext& testCtx, const char* comment)
{
	testCtx.getLog() << TestLog::Message << "// " << comment << TestLog::EndMessage;
}